

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O3

ON_LineCurve * __thiscall ON_LineCurve::operator=(ON_LineCurve *this,ON_Line *L)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = (L->from).x;
  dVar1 = (L->from).y;
  dVar2 = (L->from).z;
  dVar3 = (L->to).x;
  dVar4 = (L->to).z;
  (this->m_line).to.y = (L->to).y;
  (this->m_line).to.z = dVar4;
  (this->m_line).from.z = dVar2;
  (this->m_line).to.x = dVar3;
  (this->m_line).from.x = dVar5;
  (this->m_line).from.y = dVar1;
  (this->m_t).m_t[0] = 0.0;
  dVar5 = ON_Line::Length(L);
  (this->m_t).m_t[1] =
       (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5 |
               (ulong)((uint)(-(ulong)(dVar5 == 0.0) >> 0x20) & 0x3ff00000) << 0x20);
  this->m_dim = 3;
  return this;
}

Assistant:

ON_LineCurve& ON_LineCurve::operator=( const ON_Line& L )
{
  m_line = L;
  m_t.m_t[0] = 0.0;
  m_t.m_t[1] = L.Length();
  if ( m_t.m_t[1] == 0.0 )
    m_t.m_t[1] = 1.0;
  m_dim = 3;
  return *this;
}